

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O3

int mm_read_mtx_crd(char *fname,int *M,int *N,int *nz,int **I,int **J,double **val,
                   MM_typecode *matcode)

{
  char cVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  double *val_00;
  MM_typecode *extraout_RDX;
  MM_typecode *extraout_RDX_00;
  MM_typecode *pacVar4;
  int M_00;
  int *J_00;
  long lVar5;
  
  iVar2 = strcmp(fname,"stdin");
  __stream = _stdin;
  if ((iVar2 != 0) && (__stream = fopen(fname,"r"), __stream == (FILE *)0x0)) {
    return 0xb;
  }
  iVar2 = mm_read_banner((FILE *)__stream,matcode);
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = mm_is_valid(*matcode);
  if (iVar2 == 0) {
    return 0xf;
  }
  if ((*matcode)[1] != 'C') {
    return 0xf;
  }
  if ((*matcode)[0] != 'M') {
    return 0xf;
  }
  iVar2 = mm_read_mtx_crd_size((FILE *)__stream,M,N,nz);
  M_00 = (int)M;
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = *nz;
  lVar5 = (long)iVar2;
  piVar3 = (int *)malloc(lVar5 * 4);
  *I = piVar3;
  piVar3 = (int *)malloc(lVar5 * 4);
  *J = piVar3;
  *val = (double *)0x0;
  cVar1 = (*matcode)[2];
  if (cVar1 == 'R') {
    val_00 = (double *)malloc(lVar5 << 3);
    *val = val_00;
    piVar3 = *I;
    J_00 = *J;
    pacVar4 = extraout_RDX_00;
  }
  else if (cVar1 == 'P') {
    piVar3 = *I;
    J_00 = *J;
    val_00 = (double *)0x0;
    pacVar4 = matcode;
  }
  else {
    if (cVar1 != 'C') goto LAB_001042cf;
    val_00 = (double *)malloc(lVar5 << 4);
    *val = val_00;
    piVar3 = *I;
    J_00 = *J;
    pacVar4 = extraout_RDX;
  }
  iVar2 = mm_read_mtx_crd_data((FILE *)__stream,M_00,(int)pacVar4,iVar2,piVar3,J_00,val_00,*matcode)
  ;
  if (iVar2 != 0) {
    return iVar2;
  }
LAB_001042cf:
  if (__stream != _stdin) {
    fclose(__stream);
  }
  return 0;
}

Assistant:

int mm_read_mtx_crd(char *fname, int *M, int *N, int *nz, int **I, int **J,
                    double **val, MM_typecode *matcode) {
    int ret_code;
    FILE *f;

    if (strcmp(fname, "stdin") == 0) f = stdin;
    else if ((f = fopen(fname, "r")) == NULL)
        return MM_COULD_NOT_READ_FILE;


    if ((ret_code = mm_read_banner(f, matcode)) != 0)
        return ret_code;

    if (!(mm_is_valid(*matcode) && mm_is_sparse(*matcode) &&
          mm_is_matrix(*matcode)))
        return MM_UNSUPPORTED_TYPE;

    if ((ret_code = mm_read_mtx_crd_size(f, M, N, nz)) != 0)
        return ret_code;


    *I = (int *) malloc(*nz * sizeof(int));
    *J = (int *) malloc(*nz * sizeof(int));
    *val = NULL;

    if (mm_is_complex(*matcode)) {
        *val = (double *) malloc(*nz * 2 * sizeof(double));
        ret_code = mm_read_mtx_crd_data(f, *M, *N, *nz, *I, *J, *val,
                                        *matcode);
        if (ret_code != 0) return ret_code;
    } else if (mm_is_real(*matcode)) {
        *val = (double *) malloc(*nz * sizeof(double));
        ret_code = mm_read_mtx_crd_data(f, *M, *N, *nz, *I, *J, *val,
                                        *matcode);
        if (ret_code != 0) return ret_code;
    } else if (mm_is_pattern(*matcode)) {
        ret_code = mm_read_mtx_crd_data(f, *M, *N, *nz, *I, *J, *val,
                                        *matcode);
        if (ret_code != 0) return ret_code;
    }

    if (f != stdin) fclose(f);
    return 0;
}